

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O2

bool ON_CreateUuid(ON_UUID *new_uuid)

{
  uuid_generate((uchar *)new_uuid);
  return true;
}

Assistant:

bool ON_CreateUuid( ON_UUID& new_uuid )
{
  // See http://www.faqs.org/rfcs/rfc4122.html for uuid details.

#if 0
  {
    // Use this code when testing reqires "repeatable uniqueness".
    // NEVER check in this code.
    static ON_UUID x = ON_nil_uid;
    x = ON_NextNotUniqueId(x);
    new_uuid = x;
#pramga message("warning: NEVER COMMIT THIS CODE - ON_CreateUuid in TEST MODE.")
  }
  return true;

#else

#if defined(ON_COMPILER_MSC)
  // Header: Declared in Rpcdce.h.
  // Library: Use Rpcrt4.lib  
#pragma comment(lib, "Rpcrt4.lib")
  ::UuidCreate(&new_uuid);
  //::UuidCreateSequential(&new_uuid); // faster but computer MAC address
                                       // identifies the user and some
                                       // customers may object.
  return true;
#elif defined(ON_RUNTIME_APPLE)
  // Header: #include <uuid/uuid.h>
  if ( ON::endian::little_endian == ON::Endian() )
  {
    // Intel cpu mac
    // The uuid_generate() function returns a UUID in network or 
    // big-endian order.  The rest of OpenNURBS assumes that a UUID
    // is stored in native byte order, so we switch the byte order
    // of the UUID.
    uuid_t apple_osx_uuid;
    uuid_generate(apple_osx_uuid);
    unsigned char* dst = (unsigned char*)&new_uuid;
    const unsigned char* src = (const unsigned char*)&apple_osx_uuid;
    *dst++ = src[little_endian_rho[ 0]]; 
    *dst++ = src[little_endian_rho[ 1]]; 
    *dst++ = src[little_endian_rho[ 2]]; 
    *dst++ = src[little_endian_rho[ 3]]; 
    *dst++ = src[little_endian_rho[ 4]]; 
    *dst++ = src[little_endian_rho[ 5]]; 
    *dst++ = src[little_endian_rho[ 6]]; 
    *dst++ = src[little_endian_rho[ 7]]; 
    *dst++ = src[little_endian_rho[ 8]]; 
    *dst++ = src[little_endian_rho[ 9]]; 
    *dst++ = src[little_endian_rho[10]]; 
    *dst++ = src[little_endian_rho[11]]; 
    *dst++ = src[little_endian_rho[12]]; 
    *dst++ = src[little_endian_rho[13]]; 
    *dst++ = src[little_endian_rho[14]]; 
    *dst   = src[little_endian_rho[15]]; 
  }
  else
  {
    // Motorola cpu mac
    uuid_generate((unsigned char*)&new_uuid);
  }
  
#if defined (ON_DEBUG)
  // OS X generates version 4 UUIDs.  Check that this is still true after changing the byte order.
  if ((new_uuid.Data3 & 0xF000) != 0x4000)
    ON_ERROR("ON_CreateUuid() failure 1");
  if (new_uuid.Data4[0] < 0x80 || new_uuid.Data4[0] >= 0xC0)
    ON_ERROR("ON_CreateUuid() failure 2");
#endif

  return true;
#else

#if defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  uuid_generate((unsigned char*)&new_uuid);
  return true;
#else

  // You must supply a way to create unique ids or you 
  // will not be able to write 3dm files.
#error TODO - generate uuid
  memset(&new_uuid,0,sizeof(ON_UUID));
  return false;
#endif

#endif
#endif
}